

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<std::array<solitaire::cards::Card,_52UL>_()>::Action
          (Action<std::array<solitaire::cards::Card,_52UL>_()> *this,
          ActionInterface<std::array<solitaire::cards::Card,_52UL>_()> *impl)

{
  ActionAdapter local_28;
  ActionInterface<std::array<solitaire::cards::Card,_52UL>_()> *local_18;
  ActionInterface<std::array<solitaire::cards::Card,_52UL>_()> *impl_local;
  Action<std::array<solitaire::cards::Card,_52UL>_()> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<std::array<solitaire::cards::Card,_52UL>_()> *)this;
  std::shared_ptr<testing::ActionInterface<std::array<solitaire::cards::Card,52ul>()>>::
  shared_ptr<testing::ActionInterface<std::array<solitaire::cards::Card,52ul>()>,void>
            ((shared_ptr<testing::ActionInterface<std::array<solitaire::cards::Card,52ul>()>> *)
             &local_28,impl);
  std::function<std::array<solitaire::cards::Card,52ul>()>::
  function<testing::Action<std::array<solitaire::cards::Card,52ul>()>::ActionAdapter,void>
            ((function<std::array<solitaire::cards::Card,52ul>()> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}